

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O0

double __thiscall lineage::heuristics::PartitionGraph::costOfEdge(PartitionGraph *this,size_t edge)

{
  size_t sVar1;
  runtime_error *this_00;
  const_reference pvVar2;
  ulong in_RSI;
  long in_RDI;
  
  sVar1 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfEdges
                    ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1cd137);
  if (sVar1 <= in_RSI) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Edge does not exist!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38),in_RSI);
  return *pvVar2;
}

Assistant:

double costOfEdge(size_t edge) const
    {
        if (edge >= this->numberOfEdges())
            throw std::runtime_error("Edge does not exist!");
        return branchingEdgeCosts_[edge];
    }